

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlayStack.cpp
# Opt level: O2

void __thiscall cursespp::OverlayStack::Push(OverlayStack *this,ILayoutPtr *layout)

{
  __normal_iterator<std::shared_ptr<cursespp::ILayout>_*,_std::vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>_>
  __position;
  __shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&layout->super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>);
  setOverlayStack((ILayoutPtr *)&_Stack_28,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<cursespp::ILayout>*,std::vector<std::shared_ptr<cursespp::ILayout>,std::allocator<std::shared_ptr<cursespp::ILayout>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<cursespp::ILayout>const>>
                         ((this->stack).
                          super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->stack).
                          super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,layout);
  if (__position._M_current !=
      (this->stack).
      super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
    ::erase(&this->stack,(const_iterator)__position._M_current);
  }
  std::
  vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>::
  insert(&this->stack,
         (this->stack).
         super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
         ._M_impl.super__Vector_impl_data._M_start,layout);
  return;
}

Assistant:

void OverlayStack::Push(ILayoutPtr layout) {
    setOverlayStack(layout, this);

    auto it = std::find(
        this->stack.begin(),
        this->stack.end(), layout);

    if (it != this->stack.end()) {
        this->stack.erase(it); /* remove; we'll promote to the top */
    }

    this->stack.insert(this->stack.begin(), layout);
}